

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitRefAs(BinaryInstWriter *this,RefAs *curr)

{
  RefAsOp RVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  LEB<unsigned_int,_unsigned_char> *this_01;
  LEB<unsigned_int,_unsigned_char> local_1c;
  LEB<unsigned_int,_unsigned_char> local_18;
  uchar local_13 [3];
  
  RVar1 = curr->op;
  if (RVar1 == ExternConvertAny) {
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_13[0] = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,local_13);
    this_01 = &local_1c;
    local_1c.value = 0x1b;
    __buf = extraout_RDX_00;
  }
  else {
    if (RVar1 != AnyConvertExtern) {
      if (RVar1 == RefAsNonNull) {
        local_13[2] = 0xd4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   local_13 + 2);
        return;
      }
      handle_unreachable("invalid ref.as_*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x9e1);
    }
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_13[1] = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,local_13 + 1);
    this_01 = &local_18;
    local_18.value = 0x1a;
    __buf = extraout_RDX;
  }
  LEB<unsigned_int,_unsigned_char>::write(this_01,(int)this_00,__buf,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitRefAs(RefAs* curr) {
  switch (curr->op) {
    case RefAsNonNull:
      o << int8_t(BinaryConsts::RefAsNonNull);
      break;
    case AnyConvertExtern:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::AnyConvertExtern);
      break;
    case ExternConvertAny:
      o << int8_t(BinaryConsts::GCPrefix)
        << U32LEB(BinaryConsts::ExternConvertAny);
      break;
    default:
      WASM_UNREACHABLE("invalid ref.as_*");
  }
}